

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_PrintDebug(DdManager *dd,DdNode *f,int n,int pr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  uint local_4c;
  int retval;
  double minterms;
  int leaves;
  int nodes;
  DdNode *bzero;
  DdNode *azero;
  int pr_local;
  int n_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_4c = 1;
  if (f == (DdNode *)0x0) {
    fprintf((FILE *)dd->out,": is the NULL DD\n");
    fflush((FILE *)dd->out);
    dd_local._4_4_ = 0;
  }
  else if (((f == dd->zero) || (f == (DdNode *)((ulong)dd->one ^ 1))) && (0 < pr)) {
    fprintf((FILE *)dd->out,": is the zero DD\n");
    fflush((FILE *)dd->out);
    dd_local._4_4_ = 1;
  }
  else {
    if (0 < pr) {
      uVar1 = Cudd_DagSize(f);
      local_4c = (uint)(uVar1 != 0xffffffff);
      uVar2 = Cudd_CountLeaves(f);
      if (uVar2 == 0xffffffff) {
        local_4c = 0;
      }
      dVar4 = Cudd_CountMinterm(dd,f,n);
      if ((dVar4 == -1.0) && (!NAN(dVar4))) {
        local_4c = 0;
      }
      fprintf((FILE *)dd->out,": %d nodes %d leaves %g minterms\n",dVar4,(ulong)uVar1,(ulong)uVar2);
      if ((2 < pr) && (iVar3 = cuddP(dd,f), iVar3 == 0)) {
        local_4c = 0;
      }
      if ((pr == 2) || (3 < pr)) {
        iVar3 = Cudd_PrintMinterm(dd,f);
        if (iVar3 == 0) {
          local_4c = 0;
        }
        fprintf((FILE *)dd->out,"\n");
      }
      fflush((FILE *)dd->out);
    }
    dd_local._4_4_ = local_4c;
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_PrintDebug(
  DdManager * dd,
  DdNode * f,
  int  n,
  int  pr)
{
    DdNode *azero, *bzero;
    int    nodes;
    int    leaves;
    double minterms;
    int    retval = 1;

    if (f == NULL) {
        (void) fprintf(dd->out,": is the NULL DD\n");
        (void) fflush(dd->out);
        return(0);
    }
    azero = DD_ZERO(dd);
    bzero = Cudd_Not(DD_ONE(dd));
    if ((f == azero || f == bzero) && pr > 0){
       (void) fprintf(dd->out,": is the zero DD\n");
       (void) fflush(dd->out);
       return(1);
    }
    if (pr > 0) {
        nodes = Cudd_DagSize(f);
        if (nodes == CUDD_OUT_OF_MEM) retval = 0;
        leaves = Cudd_CountLeaves(f);
        if (leaves == CUDD_OUT_OF_MEM) retval = 0;
        minterms = Cudd_CountMinterm(dd, f, n);
        if (minterms == (double)CUDD_OUT_OF_MEM) retval = 0;
        (void) fprintf(dd->out,": %d nodes %d leaves %g minterms\n",
                       nodes, leaves, minterms);
        if (pr > 2) {
            if (!cuddP(dd, f)) retval = 0;
        }
        if (pr == 2 || pr > 3) {
            if (!Cudd_PrintMinterm(dd,f)) retval = 0;
            (void) fprintf(dd->out,"\n");
        }
        (void) fflush(dd->out);
    }
    return(retval);

}